

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# party.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  flvtag_avcpackettype_t fVar2;
  uint32_t uVar3;
  FILE *flv_00;
  char local_88 [8];
  char partyDudes [64];
  FILE *out;
  FILE *flv;
  int local_30;
  int has_video;
  int has_audio;
  uint32_t nextParty;
  flvtag_t tag;
  char **argv_local;
  int argc_local;
  
  has_video = 1000;
  tag.aloc = (size_t)argv;
  flv_00 = flv_open_read(argv[1]);
  partyDudes._56_8_ = flv_open_write(*(char **)(tag.aloc + 0x10));
  flvtag_init((flvtag_t *)&has_audio);
  iVar1 = flv_read_header(flv_00,&local_30,(int *)((long)&flv + 4));
  if (iVar1 == 0) {
    fprintf(_stderr,"%s is not an flv file\n",*(undefined8 *)(tag.aloc + 8));
    argv_local._4_4_ = 1;
  }
  else {
    flv_write_header((FILE *)partyDudes._56_8_,local_30,flv._4_4_);
    while( true ) {
      iVar1 = flv_read_tag(flv_00,(flvtag_t *)&has_audio);
      if (iVar1 == 0) break;
      fVar2 = flvtag_avcpackettype((flvtag_t *)&has_audio);
      iVar1 = has_video;
      if (fVar2 == flvtag_avcpackettype_nalu) {
        uVar3 = flvtag_timestamp((flvtag_t *)&has_audio);
        if ((uint)iVar1 <= uVar3) {
          get_dudes(local_88);
          flvtag_addcaption_text((flvtag_t *)&has_audio,local_88);
          fprintf(_stderr,"%d: %s\n",(ulong)(uint)has_video,local_88);
          has_video = has_video + 500;
        }
      }
      flv_write_tag((FILE *)partyDudes._56_8_,(flvtag_t *)&has_audio);
    }
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    flvtag_t tag;
    uint32_t nextParty = 1000;
    int has_audio, has_video;
    FILE* flv = flv_open_read(argv[1]);
    FILE* out = flv_open_write(argv[2]);
    char partyDudes[64];

    flvtag_init(&tag);

    if (!flv_read_header(flv, &has_audio, &has_video)) {
        fprintf(stderr, "%s is not an flv file\n", argv[1]);
        return EXIT_FAILURE;
    }

    flv_write_header(out, has_audio, has_video);

    while (flv_read_tag(flv, &tag)) {

        if (flvtag_avcpackettype_nalu == flvtag_avcpackettype(&tag) && nextParty <= flvtag_timestamp(&tag)) {
            get_dudes(partyDudes);

            if (CAPTION_METHOD == CAPTION_METHOD_SEI_708) {
                flvtag_addcaption_text(&tag, partyDudes);
            } else if (CAPTION_METHOD == CAPTION_METHOD_AMF_708) {
                write_amfcaptions_708(out, nextParty, partyDudes);
            } else if (CAPTION_METHOD == CAPTION_METHOD_AMF_708) {
                write_amfcaptions_utf8(out, nextParty, partyDudes);
            } else {
                fprintf(stderr, "Unknnow method\n");
                return EXIT_FAILURE;
            }

            fprintf(stderr, "%d: %s\n", nextParty, partyDudes);
            nextParty += 500; // party all the time
        }

        flv_write_tag(out, &tag);
    }

    return EXIT_SUCCESS;
}